

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.c
# Opt level: O2

size_t ZSTD_entropyCompressSeqStore
                 (seqStore_t *seqStorePtr,ZSTD_entropyCTables_t *prevEntropy,
                 ZSTD_entropyCTables_t *nextEntropy,ZSTD_CCtx_params *cctxParams,void *dst,
                 size_t dstCapacity,size_t srcSize,void *entropyWorkspace,size_t entropyWkspSize,
                 int bmi2)

{
  ZSTD_fseCTables_t *nextEntropy_00;
  ZSTD_strategy ZVar1;
  uint uVar2;
  seqDef *sequences;
  seqDef *psVar3;
  BYTE *src;
  BYTE *pBVar4;
  BYTE *ofCodeTable;
  BYTE *llCodeTable;
  BYTE *mlCodeTable;
  int disableLiteralCompression;
  size_t err_code;
  size_t sVar5;
  byte *pbVar6;
  byte bVar7;
  ulong nbSeq;
  ZSTD_symbolEncodingTypeStats_t local_50;
  
  ZVar1 = (cctxParams->cParams).strategy;
  uVar2 = (cctxParams->cParams).windowLog;
  sequences = seqStorePtr->sequencesStart;
  psVar3 = seqStorePtr->sequences;
  src = seqStorePtr->litStart;
  pBVar4 = seqStorePtr->lit;
  ofCodeTable = seqStorePtr->ofCode;
  llCodeTable = seqStorePtr->llCode;
  mlCodeTable = seqStorePtr->mlCode;
  disableLiteralCompression = ZSTD_disableLiteralsCompression(cctxParams);
  sVar5 = ZSTD_compressLiterals
                    (&prevEntropy->huf,&nextEntropy->huf,ZVar1,disableLiteralCompression,dst,
                     dstCapacity,src,(long)pBVar4 - (long)src,
                     (void *)((long)entropyWorkspace + 0xd4),0x1904,(int)entropyWkspSize);
  if (sVar5 < 0xffffffffffffff89) {
    if ((long)(dstCapacity - sVar5) < 4) {
      sVar5 = 0xffffffffffffffba;
    }
    else {
      nbSeq = (long)psVar3 - (long)sequences >> 3;
      pbVar6 = (byte *)(sVar5 + (long)dst);
      if (nbSeq < 0x80) {
        *pbVar6 = (byte)nbSeq;
        pbVar6 = pbVar6 + 1;
      }
      else if (nbSeq < 0x7f00) {
        *pbVar6 = (byte)(nbSeq >> 8) | 0x80;
        pbVar6[1] = (byte)nbSeq;
        pbVar6 = pbVar6 + 2;
      }
      else {
        *pbVar6 = 0xff;
        *(short *)(pbVar6 + 1) = (short)nbSeq + -0x7f00;
        pbVar6 = pbVar6 + 3;
      }
      nextEntropy_00 = &nextEntropy->fse;
      if (psVar3 == sequences) {
        memcpy(nextEntropy_00,&prevEntropy->fse,0xde0);
      }
      else {
        ZSTD_buildSequencesStatistics
                  (&local_50,seqStorePtr,nbSeq,&prevEntropy->fse,nextEntropy_00,pbVar6 + 1,
                   (BYTE *)((long)dst + dstCapacity),ZVar1,(uint *)entropyWorkspace,
                   (void *)((long)entropyWorkspace + 0xd4),0x1904);
        sVar5 = local_50.size;
        if (0xffffffffffffff88 < local_50.size) goto LAB_001a7112;
        *pbVar6 = (char)(local_50.Offtype << 4) + (char)(local_50.LLtype << 6) +
                  (char)local_50.MLtype * '\x04';
        pbVar6 = pbVar6 + 1 + local_50.size;
        sVar5 = ZSTD_encodeSequences
                          (pbVar6,(long)((long)dst + dstCapacity) - (long)pbVar6,
                           (nextEntropy->fse).matchlengthCTable,mlCodeTable,
                           nextEntropy_00->offcodeCTable,ofCodeTable,
                           (nextEntropy->fse).litlengthCTable,llCodeTable,sequences,nbSeq,
                           (uint)(0x39 < uVar2),(int)entropyWkspSize);
        if (0xffffffffffffff88 < sVar5) goto LAB_001a7112;
        if ((local_50.lastCountSize != 0) && (local_50.lastCountSize + sVar5 < 4)) {
          return 0;
        }
        pbVar6 = pbVar6 + sVar5;
      }
      sVar5 = (long)pbVar6 - (long)dst;
      if (sVar5 == 0) {
        return 0;
      }
    }
  }
LAB_001a7112:
  if ((srcSize <= dstCapacity) && (sVar5 == 0xffffffffffffffba)) {
    return 0;
  }
  if (0xffffffffffffff88 < sVar5) {
    return sVar5;
  }
  ZVar1 = (cctxParams->cParams).strategy;
  bVar7 = 6;
  if (ZSTD_btopt < ZVar1) {
    bVar7 = (char)ZVar1 - 1;
  }
  if ((srcSize - (srcSize >> (bVar7 & 0x3f))) - 2 <= sVar5) {
    return 0;
  }
  return sVar5;
}

Assistant:

MEM_STATIC size_t
ZSTD_entropyCompressSeqStore(seqStore_t* seqStorePtr,
                       const ZSTD_entropyCTables_t* prevEntropy,
                             ZSTD_entropyCTables_t* nextEntropy,
                       const ZSTD_CCtx_params* cctxParams,
                             void* dst, size_t dstCapacity,
                             size_t srcSize,
                             void* entropyWorkspace, size_t entropyWkspSize,
                             int bmi2)
{
    size_t const cSize = ZSTD_entropyCompressSeqStore_internal(
                            seqStorePtr, prevEntropy, nextEntropy, cctxParams,
                            dst, dstCapacity,
                            entropyWorkspace, entropyWkspSize, bmi2);
    if (cSize == 0) return 0;
    /* When srcSize <= dstCapacity, there is enough space to write a raw uncompressed block.
     * Since we ran out of space, block must be not compressible, so fall back to raw uncompressed block.
     */
    if ((cSize == ERROR(dstSize_tooSmall)) & (srcSize <= dstCapacity))
        return 0;  /* block not compressed */
    FORWARD_IF_ERROR(cSize, "ZSTD_entropyCompressSeqStore_internal failed");

    /* Check compressibility */
    {   size_t const maxCSize = srcSize - ZSTD_minGain(srcSize, cctxParams->cParams.strategy);
        if (cSize >= maxCSize) return 0;  /* block not compressed */
    }
    DEBUGLOG(4, "ZSTD_entropyCompressSeqStore() cSize: %zu", cSize);
    return cSize;
}